

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

basic_appender<char>
fmt::v11::detail::
do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<float>,fmt::v11::detail::digit_grouping<char>>
          (basic_appender<char> out,decimal_fp<float> *f,format_specs *specs,sign s,int exp_upper,
          locale_ref loc)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  basic_appender<char> bVar4;
  int iVar5;
  ulong uVar6;
  char *pcVar7;
  char *pcVar8;
  uint uVar9;
  buffer<char> *buf;
  int iVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  char cVar13;
  byte bVar14;
  uint uVar15;
  long lVar16;
  int iVar17;
  ulong uVar18;
  size_t sVar19;
  char decimal_point;
  char zero;
  bool pointy;
  int significand_size;
  significand_type significand;
  int exp;
  anon_class_28_8_ce6b8c4d write;
  int num_zeros;
  undefined1 local_e6 [2];
  bool local_e4 [16];
  int local_d4;
  format_specs local_d0;
  undefined1 local_c0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  _Alloc_hider local_a0;
  format_specs *local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  char *local_80;
  ulong local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  int *local_60;
  int *local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  digit_grouping<char> *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  uVar15 = f->significand;
  uVar1 = 0x1f;
  if ((uVar15 | 1) != 0) {
    for (; (uVar15 | 1) >> uVar1 == 0; uVar1 = uVar1 - 1) {
    }
  }
  uVar18 = (ulong)uVar15 + *(long *)(do_count_digits(unsigned_int)::table + (ulong)uVar1 * 8);
  iVar5 = (int)(uVar18 >> 0x20);
  uVar6 = (ulong)((iVar5 + 1) - (uint)(s == none));
  local_e6[1] = '0';
  uVar1 = (specs->super_basic_specs).data_;
  local_e6[0] = '.';
  local_e4._4_8_ = out.container;
  local_d4 = iVar5;
  local_d0.super_basic_specs.data_ = uVar15;
  local_d0.super_basic_specs.fill_data_ = (char  [4])s;
  if ((uVar1 >> 0xe & 1) != 0) {
    local_d0.width = exp_upper;
    local_78 = (ulong)uVar15;
    local_e6[0] = decimal_point_impl<char>(loc);
    uVar15 = (uint)local_78;
    uVar1 = (specs->super_basic_specs).data_;
    exp_upper = local_d0.width;
  }
  uVar12 = local_b0._M_allocated_capacity;
  uVar11 = local_e4._4_8_;
  uVar9 = f->exponent;
  iVar17 = uVar9 + iVar5;
  iVar2 = specs->precision;
  bVar14 = (byte)uVar1 & 7;
  if (bVar14 == 1) goto LAB_0039b035;
  if ((uVar1 & 7) != 2) {
    if (iVar17 < -3) {
LAB_0039b035:
      iVar10 = uVar9 + iVar5 + -1;
      if ((uVar1 >> 0xd & 1) == 0) {
        uVar18 = 0;
        if (iVar5 == 1) {
          local_e6[0] = '\0';
          uVar18 = 0;
        }
      }
      else {
        uVar18 = 0;
        if (0 < iVar2 - iVar5) {
          uVar18 = (ulong)(uint)(iVar2 - iVar5);
        }
        uVar6 = uVar6 + uVar18;
      }
      iVar2 = 1 - iVar17;
      if (0 < iVar17) {
        iVar2 = iVar10;
      }
      lVar16 = 2;
      if (99 < iVar2) {
        lVar16 = (ulong)(999 < iVar2) + 3;
      }
      sVar19 = (3 - (ulong)(local_e6[0] == '\0')) + uVar6 + lVar16;
      local_c0._4_4_ = uVar15;
      local_c0._0_4_ = s;
      local_c0[0xc] = local_e6[0];
      local_c0._8_4_ = iVar5;
      local_b0._M_allocated_capacity._0_5_ = CONCAT14('0',(int)uVar18);
      local_b0._M_allocated_capacity._6_2_ = SUB82(uVar12,6);
      local_b0._M_allocated_capacity =
           CONCAT26(local_b0._M_allocated_capacity._6_2_,
                    CONCAT15(((uVar1 >> 0xc & 1) == 0) << 5,local_b0._M_allocated_capacity._0_5_)) |
           0x450000000000;
      local_b0._8_4_ = iVar10;
      if (specs->width < 1) {
        uVar6 = sVar19 + *(size_t *)(local_e4._4_8_ + 8);
        if (*(size_t *)(local_e4._4_8_ + 0x10) < uVar6) {
          (**(grow_fun *)(local_e4._4_8_ + 0x18))((buffer<char> *)local_e4._4_8_,uVar6);
        }
        bVar4 = do_write_float<char,_fmt::v11::basic_appender<char>,_fmt::v11::detail::dragonbox::decimal_fp<float>,_fmt::v11::detail::digit_grouping<char>_>
                ::anon_class_28_8_ce6b8c4d::operator()
                          ((anon_class_28_8_ce6b8c4d *)local_c0,(iterator)uVar11);
      }
      else {
        bVar4 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<float>,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<float>const&,fmt::v11::format_specs_const&,fmt::v11::sign,int,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_1_&>
                          ((basic_appender<char>)local_e4._4_8_,specs,sVar19,sVar19,
                           (anon_class_28_8_ce6b8c4d *)local_c0);
      }
      return (basic_appender<char>)bVar4.container;
    }
    if (0 < iVar2) {
      exp_upper = iVar2;
    }
    if (exp_upper < iVar17) goto LAB_0039b035;
  }
  local_d0.precision = iVar17;
  if (-1 < (int)uVar9) {
    lVar16 = uVar6 + uVar9;
    local_e4._0_4_ = iVar2 - iVar17;
    if ((uVar1 >> 0xd & 1) != 0) {
      lVar16 = lVar16 + 1;
      if (((int)local_e4._0_4_ < 1) && (bVar14 != 2)) {
        local_e4[0] = false;
        local_e4[1] = false;
        local_e4[2] = false;
        local_e4[3] = false;
      }
      else if (0 < (int)local_e4._0_4_) {
        lVar16 = lVar16 + (ulong)(uint)local_e4._0_4_;
      }
    }
    digit_grouping<char>::digit_grouping<fmt::v11::detail::locale_ref,_0>
              ((digit_grouping<char> *)&local_70,loc,(bool)((byte)(uVar1 >> 0xe) & 1));
    iVar5 = 0;
    if (local_48 != (digit_grouping<char> *)0x0) {
      pcVar8 = (char *)(local_70._8_8_ + local_70._M_allocated_capacity);
      lVar3 = 0;
      uVar12 = local_70._M_allocated_capacity;
      do {
        if ((char *)uVar12 == pcVar8) {
          cVar13 = pcVar8[-1];
          uVar12 = pcVar8;
        }
        else {
          cVar13 = *(char *)uVar12;
          if ((byte)(cVar13 + 0x81U) < 0x82) goto LAB_0039b247;
          uVar12 = (char *)(uVar12 + 1);
        }
        iVar5 = iVar5 + cVar13;
        if (iVar17 <= iVar5) goto LAB_0039b247;
        lVar3 = lVar3 + 1;
      } while( true );
    }
    lVar3 = 0;
LAB_0039b247:
    local_c0._0_8_ = local_d0.super_basic_specs.fill_data_;
    local_c0._8_8_ = &local_d0;
    local_b0._M_allocated_capacity = (size_type)&local_d4;
    local_90._M_allocated_capacity = (size_type)local_e6;
    local_90._8_8_ = local_e4;
    local_80 = local_e6 + 1;
    local_b0._8_8_ = f;
    local_a0._M_p = (pointer)&local_70;
    local_98 = specs;
    bVar4 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<float>,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<float>const&,fmt::v11::format_specs_const&,fmt::v11::sign,int,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_2_&>
                      ((basic_appender<char>)uVar11,specs,lVar16 + lVar3,lVar16 + lVar3,
                       (anon_class_72_9_eb40e20e *)local_c0);
    if (local_50 != &local_40) {
      operator_delete(local_50,(ulong)(local_40._M_allocated_capacity + 1));
    }
    uVar11 = local_60;
    uVar12 = local_70._M_allocated_capacity;
    if ((int **)local_70._M_allocated_capacity == &local_60) {
      return (basic_appender<char>)bVar4.container;
    }
LAB_0039b3ab:
    operator_delete((void *)uVar12,uVar11 + 1);
    return (basic_appender<char>)bVar4.container;
  }
  if (0 < iVar17) {
    uVar9 = 0;
    local_e4._0_4_ = iVar2 - iVar5 & (int)(uVar1 << 0x12) >> 0x1f;
    uVar15 = local_e4._0_4_;
    if ((int)local_e4._0_4_ < 1) {
      uVar15 = uVar9;
    }
    digit_grouping<char>::digit_grouping<fmt::v11::detail::locale_ref,_0>
              ((digit_grouping<char> *)local_c0,loc,(bool)((byte)(uVar1 >> 0xe) & 1));
    if (local_98 != (format_specs *)0x0) {
      pcVar7 = (char *)(local_c0._0_8_ + local_c0._8_8_);
      lVar16 = 0;
      pcVar8 = (char *)local_c0._0_8_;
      do {
        if (pcVar8 == pcVar7) {
          cVar13 = pcVar7[-1];
          pcVar8 = pcVar7;
        }
        else {
          cVar13 = *pcVar8;
          if ((byte)(cVar13 + 0x81U) < 0x82) goto LAB_0039b31c;
          pcVar8 = pcVar8 + 1;
        }
        uVar9 = uVar9 + (int)cVar13;
        if (iVar17 <= (int)uVar9) goto LAB_0039b31c;
        lVar16 = lVar16 + 1;
      } while( true );
    }
    lVar16 = 0;
LAB_0039b31c:
    sVar19 = uVar15 + uVar6 + 1 + lVar16;
    local_70._M_allocated_capacity = (size_type)local_d0.super_basic_specs.fill_data_;
    local_70._8_8_ = &local_d0;
    local_60 = &local_d4;
    local_58 = &local_d0.precision;
    local_50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_e6;
    local_40._M_allocated_capacity = (size_type)local_e4;
    local_40._8_8_ = local_e6 + 1;
    local_48 = (digit_grouping<char> *)local_c0;
    bVar4 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<float>,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<float>const&,fmt::v11::format_specs_const&,fmt::v11::sign,int,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_3_&>
                      ((basic_appender<char>)local_e4._4_8_,specs,sVar19,sVar19,
                       (anon_class_64_8_085c650e *)&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_p != &local_90) {
      operator_delete(local_a0._M_p,(ulong)(local_90._M_allocated_capacity + 1));
    }
    uVar11 = local_b0._M_allocated_capacity;
    uVar12 = local_c0._0_8_;
    if ((undefined1 *)local_c0._0_8_ == local_c0 + 0x10) {
      return (basic_appender<char>)bVar4.container;
    }
    goto LAB_0039b3ab;
  }
  iVar5 = -iVar17;
  local_70._M_allocated_capacity._0_4_ = iVar5;
  if (uVar18 >> 0x20 == 0) {
    if ((-1 < iVar2) && (SBORROW4(iVar2,iVar5) != iVar2 + iVar17 < 0)) {
      local_70._M_allocated_capacity._0_4_ = iVar2;
      iVar5 = iVar2;
    }
    if (iVar5 == 0) {
      local_e4[0] = (bool)(char)((uVar1 & 0x2000) >> 0xd);
      iVar2 = 2 - (uint)((uVar1 & 0x2000) == 0);
      iVar5 = 0;
      goto LAB_0039b3d0;
    }
  }
  local_e4[0] = true;
  iVar2 = 2;
LAB_0039b3d0:
  sVar19 = uVar6 + (uint)(iVar5 + iVar2);
  local_c0._0_8_ = local_d0.super_basic_specs.fill_data_;
  local_c0._8_8_ = local_e4;
  local_b0._M_allocated_capacity = (size_type)local_e6;
  local_b0._8_8_ = &local_70;
  local_a0._M_p = local_e6 + 1;
  local_98 = &local_d0;
  local_90._M_allocated_capacity = (size_type)&local_d4;
  bVar4 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<float>,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<float>const&,fmt::v11::format_specs_const&,fmt::v11::sign,int,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_4_&>
                    ((basic_appender<char>)local_e4._4_8_,specs,sVar19,sVar19,
                     (anon_class_56_7_88befd79 *)local_c0);
  return (basic_appender<char>)bVar4.container;
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& f,
                                    const format_specs& specs, sign s,
                                    int exp_upper, locale_ref loc) -> OutputIt {
  auto significand = f.significand;
  int significand_size = get_significand_size(f);
  const Char zero = static_cast<Char>('0');
  size_t size = to_unsigned(significand_size) + (s != sign::none ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point = specs.localized() ? detail::decimal_point<Char>(loc)
                                         : static_cast<Char>('.');

  int output_exp = f.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (specs.type() == presentation_type::exp) return true;
    if (specs.type() == presentation_type::fixed) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4;
    return output_exp < exp_lower ||
           output_exp >= (specs.precision > 0 ? specs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (specs.alt()) {
      num_zeros = specs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = specs.upper() ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (s != sign::none) *it++ = detail::getsign<Char>(s);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0
               ? write_padded<Char, align::right>(out, specs, size, write)
               : base_iterator(out, write(reserve(out, size)));
  }

  int exp = f.exponent + significand_size;
  if (f.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(f.exponent);
    int num_zeros = specs.precision - exp;
    abort_fuzzing_if(num_zeros > 5000);
    if (specs.alt()) {
      ++size;
      if (num_zeros <= 0 && specs.type() != presentation_type::fixed)
        num_zeros = 0;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    auto grouping = Grouping(loc, specs.localized());
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<Char, align::right>(out, specs, size, [&](iterator it) {
      if (s != sign::none) *it++ = detail::getsign<Char>(s);
      it = write_significand<Char>(it, significand, significand_size,
                                   f.exponent, grouping);
      if (!specs.alt()) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = specs.alt() ? specs.precision - significand_size : 0;
    size += 1 + static_cast<unsigned>(max_of(num_zeros, 0));
    auto grouping = Grouping(loc, specs.localized());
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<Char, align::right>(out, specs, size, [&](iterator it) {
      if (s != sign::none) *it++ = detail::getsign<Char>(s);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && specs.precision >= 0 &&
      specs.precision < num_zeros) {
    num_zeros = specs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || specs.alt();
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<Char, align::right>(out, specs, size, [&](iterator it) {
    if (s != sign::none) *it++ = detail::getsign<Char>(s);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}